

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O3

GregorianCalendar * __thiscall
GregorianCalendar::NthXday
          (GregorianCalendar *__return_storage_ptr__,GregorianCalendar *this,int n,int x,int month,
          int year,int day)

{
  int iVar1;
  uint uVar2;
  GregorianCalendar local_30;
  
  local_30.super_Calendar.year = year;
  local_30.super_Calendar.month = month;
  if (0 < n) {
    local_30.super_Calendar.day = day + (uint)(day == 0);
    local_30.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105cd8;
    iVar1 = operator_cast_to_int(&local_30);
    iVar1 = General::XdayOnOrBefore(iVar1 + 6,x);
    iVar1 = n * 7 + iVar1 + -7;
    goto LAB_0010299e;
  }
  if (day == 0) {
    if ((uint)month < 0xc) {
      day = 0x1e;
      if ((0xa50U >> (month & 0x1fU) & 1) == 0) {
        if (month != 2) goto LAB_001029f8;
        uVar2 = year * -0x3d70a3d7 + 0x51eb850;
        day = ((uVar2 >> 4 | year * -0x70000000) < 0xa3d70b ||
              0x28f5c28 < (uVar2 >> 2 | year * 0x40000000) && (year & 3U) == 0) | 0x1c;
      }
    }
    else {
LAB_001029f8:
      day = 0x1f;
    }
  }
  local_30.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105cd8;
  local_30.super_Calendar.day = day;
  iVar1 = operator_cast_to_int(&local_30);
  iVar1 = General::XdayOnOrBefore(iVar1,x);
  iVar1 = n * 7 + iVar1 + 7;
LAB_0010299e:
  GregorianCalendar(__return_storage_ptr__,iVar1);
  return __return_storage_ptr__;
}

Assistant:

GregorianCalendar GregorianCalendar::NthXday(int n, int x, int month, int year, int day) {
    if (n > 0) {
        if (day == 0) {
            day = 1;
        }
        GregorianCalendar calendar =
                GregorianCalendar(month, day, year);
       
        return
                GregorianCalendar
                        ((7 * (n - 1)) + General::XdayOnOrBefore(6 + calendar, x));
    }
    else {
        if (day == 0) {
            day = LastMonthDay(month, year);
        }
        GregorianCalendar calendar =
                GregorianCalendar(month, day, year);
        int date = (7 * (n + 1)) +
                General::XdayOnOrBefore(calendar, x);
        return GregorianCalendar(date);
    }
}